

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (ReplicatedAssignmentPatternExpression *this,MonitorVisitor *visitor)

{
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->count_,visitor);
  AssignmentPatternExpressionBase::visitExprs<slang::ast::builtins::MonitorVisitor&>
            (&this->super_AssignmentPatternExpressionBase,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }